

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluStrUtil.cpp
# Opt level: O0

ostream * glu::operator<<(ostream *str,ApiType apiType)

{
  Profile PVar1;
  int iVar2;
  ostream *poVar3;
  ostream *str_local;
  ApiType apiType_local;
  
  str_local._4_4_ = apiType.m_bits;
  std::operator<<(str,"OpenGL ");
  PVar1 = ApiType::getProfile((ApiType *)((long)&str_local + 4));
  if (PVar1 == PROFILE_ES) {
    std::operator<<(str,"ES ");
  }
  iVar2 = ApiType::getMajorVersion((ApiType *)((long)&str_local + 4));
  poVar3 = (ostream *)std::ostream::operator<<(str,iVar2);
  poVar3 = std::operator<<(poVar3,".");
  iVar2 = ApiType::getMinorVersion((ApiType *)((long)&str_local + 4));
  std::ostream::operator<<(poVar3,iVar2);
  PVar1 = ApiType::getProfile((ApiType *)((long)&str_local + 4));
  if (PVar1 == PROFILE_CORE) {
    std::operator<<(str," core profile");
  }
  else {
    PVar1 = ApiType::getProfile((ApiType *)((long)&str_local + 4));
    if (PVar1 == PROFILE_COMPATIBILITY) {
      std::operator<<(str," compatibility profile");
    }
    else {
      PVar1 = ApiType::getProfile((ApiType *)((long)&str_local + 4));
      if (PVar1 != PROFILE_ES) {
        std::operator<<(str," (unknown profile)");
      }
    }
  }
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, ApiType apiType)
{
	str << "OpenGL ";

	if (apiType.getProfile() == PROFILE_ES)
		str << "ES ";

	str << apiType.getMajorVersion() << "." << apiType.getMinorVersion();

	if (apiType.getProfile() == PROFILE_CORE)
		str << " core profile";
	else if (apiType.getProfile() == PROFILE_COMPATIBILITY)
		str << " compatibility profile";
	else if (apiType.getProfile() != PROFILE_ES)
		str << " (unknown profile)";

	return str;
}